

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O3

void __thiscall
CATCH2_INTERNAL_TEST_0::TestSessionConnection::TestSessionConnection(TestSessionConnection *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  TestSocketMonitor *this_00;
  SocketServer *this_01;
  TestApplication *app;
  MemoryStoreFactory *factory;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string *senderCompID;
  _func_int **pp_Var4;
  TimeRange *pTVar5;
  pointer pcVar6;
  TestSession *pTVar7;
  SocketAcceptor *pSVar8;
  SocketInitiator *pSVar9;
  TestSocketInitiator *pTVar10;
  SocketConnection *pSVar11;
  Dictionary DVar12;
  Dictionary DVar13;
  TimeRange *this_02;
  TestSession *pTVar14;
  SocketAcceptor *this_03;
  SocketInitiator *this_04;
  TestSocketInitiator *this_05;
  SocketConnection *this_06;
  size_type __dnew;
  size_type __dnew_1;
  pointer *__ptr;
  DateTime d;
  int in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9c [12];
  _Alloc_hider _Var15;
  _Alloc_hider _Var16;
  undefined **ppuVar17;
  int iVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined2 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined4 in_stack_fffffffffffffcc1;
  undefined1 in_stack_fffffffffffffcc5;
  undefined1 uVar30;
  undefined1 in_stack_fffffffffffffcc6;
  undefined1 in_stack_fffffffffffffcc7 [17];
  _Alloc_hider _Var31;
  _Alloc_hider _Var32;
  undefined1 uVar33;
  undefined7 in_stack_fffffffffffffce9;
  char local_310 [16];
  string *local_300;
  string *local_2f8;
  SessionID *local_2f0;
  SessionID *local_2e8;
  SessionID *local_2e0;
  FieldBase local_2d8;
  SessionID *local_280;
  unique_ptr<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_> *local_278;
  DataDictionaryProvider *local_270;
  string local_268;
  long *local_248;
  undefined8 local_240;
  long local_238;
  undefined2 local_230;
  long *local_228;
  undefined8 local_220;
  long local_218;
  undefined2 local_210;
  undefined4 *local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  SocketMonitor *local_1e8;
  undefined1 local_1e0 [8];
  undefined1 local_1d8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [2];
  _Alloc_hider local_1a8;
  char local_198 [16];
  FieldBase local_188;
  FieldBase local_130;
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  bool local_b8;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  SocketServer *local_90;
  FieldBase local_88;
  
  FIX::DataDictionaryProvider::DataDictionaryProvider((DataDictionaryProvider *)this);
  local_270 = &(this->super_BaseSocketConnection).acceptorProvider;
  FIX::DataDictionaryProvider::DataDictionaryProvider(local_270);
  local_2f0 = &(this->super_BaseSocketConnection).initiatorSessionID;
  FIX::SessionID::SessionID(local_2f0);
  local_300 = (string *)&(this->super_BaseSocketConnection).dictionaryInitiator;
  (this->super_BaseSocketConnection).dictionaryInitiator._vptr_Dictionary =
       (_func_int **)&PTR__Dictionary_00320f50;
  p_Var1 = &(this->super_BaseSocketConnection).dictionaryInitiator.m_data._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_BaseSocketConnection).dictionaryInitiator.m_data._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_BaseSocketConnection).dictionaryInitiator.m_data._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_BaseSocketConnection).dictionaryInitiator.m_data._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_BaseSocketConnection).dictionaryInitiator.m_data._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_BaseSocketConnection).dictionaryInitiator.m_data._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_BaseSocketConnection).dictionaryInitiator.m_name._M_dataplus._M_p =
       (pointer)&(this->super_BaseSocketConnection).dictionaryInitiator.m_name.field_2;
  (this->super_BaseSocketConnection).dictionaryInitiator.m_name._M_string_length = 0;
  (this->super_BaseSocketConnection).dictionaryInitiator.m_name.field_2._M_local_buf[0] = '\0';
  local_2e8 = (SessionID *)&(this->super_BaseSocketConnection).settingsInitiator;
  p_Var1 = &(this->super_BaseSocketConnection).settingsInitiator.m_settings._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_BaseSocketConnection).settingsInitiator.m_settings._M_t._M_impl.super__Rb_tree_header
  ._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_BaseSocketConnection).settingsInitiator.m_settings._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_BaseSocketConnection).settingsInitiator.m_settings._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_BaseSocketConnection).settingsInitiator.m_settings._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_BaseSocketConnection).settingsInitiator.m_settings._M_t._M_impl.super__Rb_tree_header
  ._M_node_count = 0;
  (this->super_BaseSocketConnection).settingsInitiator.m_defaults._vptr_Dictionary =
       (_func_int **)&PTR__Dictionary_00320f50;
  p_Var2 = &(this->super_BaseSocketConnection).settingsInitiator.m_defaults.m_data._M_t._M_impl.
            super__Rb_tree_header._M_header;
  (this->super_BaseSocketConnection).settingsInitiator.m_defaults.m_data._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_BaseSocketConnection).settingsInitiator.m_defaults.m_data._M_t._M_impl.
           super__Rb_tree_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->super_BaseSocketConnection).settingsInitiator.m_defaults.m_data._M_t._M_impl.
           super__Rb_tree_header + 0x10) = p_Var2;
  *(_Base_ptr *)
   ((long)&(this->super_BaseSocketConnection).settingsInitiator.m_defaults.m_data._M_t._M_impl.
           super__Rb_tree_header + 0x18) = p_Var2;
  *(size_t *)
   ((long)&(this->super_BaseSocketConnection).settingsInitiator.m_defaults.m_data._M_t._M_impl.
           super__Rb_tree_header + 0x20) = 0;
  (this->super_BaseSocketConnection).settingsInitiator.m_defaults.m_name._M_dataplus._M_p =
       (pointer)&(this->super_BaseSocketConnection).settingsInitiator.m_defaults.m_name.field_2;
  (this->super_BaseSocketConnection).settingsInitiator.m_defaults.m_name._M_string_length = 0;
  (this->super_BaseSocketConnection).settingsInitiator.m_defaults.m_name.field_2._M_local_buf[0] =
       '\0';
  (this->super_BaseSocketConnection).settingsInitiator.m_resolveEnvVars = false;
  local_2e0 = &(this->super_BaseSocketConnection).acceptorSessionID;
  FIX::SessionID::SessionID(local_2e0);
  local_2f8 = (string *)&(this->super_BaseSocketConnection).dictionaryAcceptor;
  (this->super_BaseSocketConnection).dictionaryAcceptor._vptr_Dictionary =
       (_func_int **)&PTR__Dictionary_00320f50;
  p_Var1 = &(this->super_BaseSocketConnection).dictionaryAcceptor.m_data._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_BaseSocketConnection).dictionaryAcceptor.m_data._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_BaseSocketConnection).dictionaryAcceptor.m_data._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_BaseSocketConnection).dictionaryAcceptor.m_data._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_BaseSocketConnection).dictionaryAcceptor.m_data._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_BaseSocketConnection).dictionaryAcceptor.m_data._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_BaseSocketConnection).dictionaryAcceptor.m_name._M_dataplus._M_p =
       (pointer)&(this->super_BaseSocketConnection).dictionaryAcceptor.m_name.field_2;
  (this->super_BaseSocketConnection).dictionaryAcceptor.m_name._M_string_length = 0;
  (this->super_BaseSocketConnection).dictionaryAcceptor.m_name.field_2._M_local_buf[0] = '\0';
  local_280 = (SessionID *)&(this->super_BaseSocketConnection).settingsAcceptor;
  p_Var1 = &(this->super_BaseSocketConnection).settingsAcceptor.m_settings._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_BaseSocketConnection).settingsAcceptor.m_settings._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_BaseSocketConnection).settingsAcceptor.m_settings._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_BaseSocketConnection).settingsAcceptor.m_settings._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_BaseSocketConnection).settingsAcceptor.m_settings._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_BaseSocketConnection).settingsAcceptor.m_settings._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_BaseSocketConnection).settingsAcceptor.m_defaults._vptr_Dictionary =
       (_func_int **)&PTR__Dictionary_00320f50;
  p_Var2 = &(this->super_BaseSocketConnection).settingsAcceptor.m_defaults.m_data._M_t._M_impl.
            super__Rb_tree_header._M_header;
  (this->super_BaseSocketConnection).settingsAcceptor.m_defaults.m_data._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_BaseSocketConnection).settingsAcceptor.m_defaults.m_data._M_t._M_impl.
           super__Rb_tree_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->super_BaseSocketConnection).settingsAcceptor.m_defaults.m_data._M_t._M_impl.
           super__Rb_tree_header + 0x10) = p_Var2;
  *(_Base_ptr *)
   ((long)&(this->super_BaseSocketConnection).settingsAcceptor.m_defaults.m_data._M_t._M_impl.
           super__Rb_tree_header + 0x18) = p_Var2;
  *(size_t *)
   ((long)&(this->super_BaseSocketConnection).settingsAcceptor.m_defaults.m_data._M_t._M_impl.
           super__Rb_tree_header + 0x20) = 0;
  (this->super_BaseSocketConnection).settingsAcceptor.m_defaults.m_name._M_dataplus._M_p =
       (pointer)&(this->super_BaseSocketConnection).settingsAcceptor.m_defaults.m_name.field_2;
  (this->super_BaseSocketConnection).settingsAcceptor.m_defaults.m_name._M_string_length = 0;
  (this->super_BaseSocketConnection).settingsAcceptor.m_defaults.m_name.field_2._M_local_buf[0] =
       '\0';
  (this->super_BaseSocketConnection).settingsAcceptor.m_resolveEnvVars = false;
  this_00 = &(this->super_BaseSocketConnection).monitor;
  FIX::SocketMonitor::SocketMonitor(&this_00->super_SocketMonitor,0);
  *(undefined ***)&(this->super_BaseSocketConnection).monitor = &PTR__SocketMonitor_0032b588;
  (this->super_BaseSocketConnection).monitor.signaledSocket = -1;
  (this->super_BaseSocketConnection).monitor.unsignalSocket = -1;
  (this->super_BaseSocketConnection).monitor.dropSocket = -1;
  (this->super_BaseSocketConnection).application.super_NullApplication.super_Application.
  _vptr_Application = (_func_int **)&PTR__Application_0032b5d8;
  (this->super_BaseSocketConnection).application.count = 0;
  *(code **)&(this->super_BaseSocketConnection).factory = FIX::SocketServer::accept;
  (this->super_BaseSocketConnection).logFactory.super_LogFactory._vptr_LogFactory =
       (_func_int **)&PTR__LogFactory_0032b648;
  this_01 = &(this->super_BaseSocketConnection).server;
  local_1e8 = &this_00->super_SocketMonitor;
  FIX::SocketServer::SocketServer(this_01,0);
  local_278 = &(this->super_BaseSocketConnection).sessionTime;
  (this->super_BaseSocketConnection).testInitiator._M_t.
  super___uniq_ptr_impl<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_>._M_t.
  super__Tuple_impl<0UL,_TestSocketInitiator_*,_std::default_delete<TestSocketInitiator>_>.
  super__Head_base<0UL,_TestSocketInitiator_*,_false>._M_head_impl = (TestSocketInitiator *)0x0;
  (this->super_BaseSocketConnection).acceptor._M_t.
  super___uniq_ptr_impl<FIX::SocketAcceptor,_std::default_delete<FIX::SocketAcceptor>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketAcceptor_*,_std::default_delete<FIX::SocketAcceptor>_>.
  super__Head_base<0UL,_FIX::SocketAcceptor_*,_false>._M_head_impl = (SocketAcceptor *)0x0;
  (this->super_BaseSocketConnection).acceptorSession._M_t.
  super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
  super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
  super__Head_base<0UL,_TestSession_*,_false>._M_head_impl = (TestSession *)0x0;
  (this->super_BaseSocketConnection).initiator._M_t.
  super___uniq_ptr_impl<FIX::SocketInitiator,_std::default_delete<FIX::SocketInitiator>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketInitiator_*,_std::default_delete<FIX::SocketInitiator>_>.
  super__Head_base<0UL,_FIX::SocketInitiator_*,_false>._M_head_impl = (SocketInitiator *)0x0;
  (this->super_BaseSocketConnection).sessionTime._M_t.
  super___uniq_ptr_impl<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>._M_t.
  super__Tuple_impl<0UL,_FIX::TimeRange_*,_std::default_delete<FIX::TimeRange>_>.
  super__Head_base<0UL,_FIX::TimeRange_*,_false>._M_head_impl = (TimeRange *)0x0;
  (this->super_BaseSocketConnection).initiatorSession._M_t.
  super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
  super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
  super__Head_base<0UL,_TestSession_*,_false>._M_head_impl = (TestSession *)0x0;
  (this->super_BaseSocketConnection).socket = 0x65;
  local_208 = &local_1f8;
  local_1f8 = 0x2e584946;
  local_200 = 7;
  uStack_1f4 = 0x322e34;
  local_90 = this_01;
  std::__cxx11::string::_M_construct<char*>((string *)&stack0xfffffffffffffcb8);
  local_310._8_8_ = (field_metrics)0x0;
  local_228 = &local_218;
  local_218 = 0x4f54414954494e49;
  local_210 = 0x52;
  local_220 = 9;
  local_2d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00320f80;
  local_2d8.m_tag = 0x31;
  local_2d8.m_string._M_dataplus._M_p = (pointer)&local_2d8.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8.m_string,local_228,(long)&local_210 + 1);
  local_2d8.m_data._M_dataplus._M_p = (pointer)&local_2d8.m_data.field_2;
  local_2d8.m_data._M_string_length = 0;
  local_2d8.m_data.field_2._M_local_buf[0] = '\0';
  local_2d8.m_metrics.m_length = 0;
  local_2d8.m_metrics.m_checksum = 0;
  local_2d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325010;
  local_248 = &local_238;
  local_240 = 6;
  local_238 = CONCAT17(local_238._7_1_,0x545045434341);
  local_88._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00320f80;
  local_88.m_tag = 0x38;
  local_88.m_string._M_dataplus._M_p = (pointer)&local_88.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88.m_string);
  paVar3 = &local_88.m_data.field_2;
  local_88.m_data._M_string_length = 0;
  local_88.m_data.field_2._M_local_buf[0] = '\0';
  local_88.m_metrics.m_length = 0;
  local_88.m_metrics.m_checksum = 0;
  local_88._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325400;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  local_88.m_data._M_dataplus._M_p = (pointer)paVar3;
  FIX::SessionID::SessionID
            ((SessionID *)local_1e0,(string *)&stack0xfffffffffffffcb8,&local_2d8.m_string,
             &local_88.m_string,&local_268);
  (this->super_BaseSocketConnection).initiatorSessionID.m_beginString.super_StringField.
  super_FieldBase.m_tag = local_1d8._0_4_;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_BaseSocketConnection).initiatorSessionID.m_beginString.super_StringField.
              super_FieldBase.m_string);
  (this->super_BaseSocketConnection).initiatorSessionID.m_beginString.super_StringField.
  super_FieldBase.m_metrics = (field_metrics)local_198._8_8_;
  (this->super_BaseSocketConnection).initiatorSessionID.m_beginString.super_StringField.
  super_FieldBase.m_data._M_string_length = 0;
  *(this->super_BaseSocketConnection).initiatorSessionID.m_beginString.super_StringField.
   super_FieldBase.m_data._M_dataplus._M_p = '\0';
  (this->super_BaseSocketConnection).initiatorSessionID.m_senderCompID.super_StringField.
  super_FieldBase.m_tag = local_188.m_tag;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_BaseSocketConnection).initiatorSessionID.m_senderCompID.super_StringField
              .super_FieldBase.m_string);
  (this->super_BaseSocketConnection).initiatorSessionID.m_senderCompID.super_StringField.
  super_FieldBase.m_metrics = local_188.m_metrics;
  (this->super_BaseSocketConnection).initiatorSessionID.m_senderCompID.super_StringField.
  super_FieldBase.m_data._M_string_length = 0;
  *(this->super_BaseSocketConnection).initiatorSessionID.m_senderCompID.super_StringField.
   super_FieldBase.m_data._M_dataplus._M_p = '\0';
  (this->super_BaseSocketConnection).initiatorSessionID.m_targetCompID.super_StringField.
  super_FieldBase.m_tag = local_130.m_tag;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_BaseSocketConnection).initiatorSessionID.m_targetCompID.super_StringField
              .super_FieldBase.m_string);
  (this->super_BaseSocketConnection).initiatorSessionID.m_targetCompID.super_StringField.
  super_FieldBase.m_metrics = local_130.m_metrics;
  (this->super_BaseSocketConnection).initiatorSessionID.m_targetCompID.super_StringField.
  super_FieldBase.m_data._M_string_length = 0;
  *(this->super_BaseSocketConnection).initiatorSessionID.m_targetCompID.super_StringField.
   super_FieldBase.m_data._M_dataplus._M_p = '\0';
  std::__cxx11::string::operator=
            ((string *)&(this->super_BaseSocketConnection).initiatorSessionID.m_sessionQualifier,
             (string *)&local_d8);
  (this->super_BaseSocketConnection).initiatorSessionID.m_isFIXT = local_b8;
  std::__cxx11::string::operator=
            ((string *)&(this->super_BaseSocketConnection).initiatorSessionID.m_frozenString,
             (string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase(&local_130);
  FIX::FieldBase::~FieldBase(&local_188);
  FIX::FieldBase::~FieldBase((FieldBase *)local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  FIX::FieldBase::~FieldBase(&local_88);
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  FIX::FieldBase::~FieldBase(&local_2d8);
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&stack0xfffffffffffffca8);
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT44(uStack_1f4,local_1f8) + 1);
  }
  local_208 = &local_1f8;
  local_1f8 = 0x2e584946;
  local_200 = 7;
  uStack_1f4 = 0x322e34;
  uVar23 = (undefined1)((ulong)&stack0xfffffffffffffcc8 >> 0x30);
  uVar25 = (undefined1)((ulong)&stack0xfffffffffffffcc8 >> 0x38);
  std::__cxx11::string::_M_construct<char*>((string *)&stack0xfffffffffffffcb8);
  _Var31._M_p = &stack0xfffffffffffffce8;
  _Var32._M_p = (pointer)0x0;
  uVar33 = '\0';
  local_310._8_8_ = (field_metrics)0x0;
  local_228 = &local_218;
  local_220 = 6;
  local_218 = CONCAT17(local_218._7_1_,0x545045434341);
  senderCompID = &local_2d8.m_string;
  local_2d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00320f80;
  local_2d8.m_tag = 0x31;
  local_2d8.m_string._M_dataplus._M_p = (pointer)&local_2d8.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)senderCompID);
  local_2d8.m_data._M_dataplus._M_p = (pointer)&local_2d8.m_data.field_2;
  local_2d8.m_data._M_string_length = 0;
  local_2d8.m_data.field_2._M_local_buf[0] = '\0';
  local_2d8.m_metrics.m_length = 0;
  local_2d8.m_metrics.m_checksum = 0;
  local_2d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325010;
  local_248 = &local_238;
  local_238 = 0x4f54414954494e49;
  local_230 = 0x52;
  local_240 = 9;
  local_88._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00320f80;
  local_88.m_tag = 0x38;
  local_88.m_string._M_dataplus._M_p = (pointer)&local_88.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88.m_string);
  local_88.m_data._M_string_length = 0;
  local_88.m_data.field_2._M_local_buf[0] = '\0';
  local_88.m_metrics.m_length = 0;
  local_88.m_metrics.m_checksum = 0;
  local_88._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325400;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  local_88.m_data._M_dataplus._M_p = (pointer)paVar3;
  FIX::SessionID::SessionID
            ((SessionID *)local_1e0,(string *)&stack0xfffffffffffffcb8,senderCompID,
             &local_88.m_string,&local_268);
  pp_Var4 = (_func_int **)(local_1d8 + 8);
  (this->super_BaseSocketConnection).acceptorSessionID.m_beginString.super_StringField.
  super_FieldBase.m_tag = local_1d8._0_4_;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_BaseSocketConnection).acceptorSessionID.m_beginString.super_StringField.
              super_FieldBase.m_string);
  (this->super_BaseSocketConnection).acceptorSessionID.m_beginString.super_StringField.
  super_FieldBase.m_metrics = (field_metrics)local_198._8_8_;
  (this->super_BaseSocketConnection).acceptorSessionID.m_beginString.super_StringField.
  super_FieldBase.m_data._M_string_length = 0;
  *(this->super_BaseSocketConnection).acceptorSessionID.m_beginString.super_StringField.
   super_FieldBase.m_data._M_dataplus._M_p = '\0';
  (this->super_BaseSocketConnection).acceptorSessionID.m_senderCompID.super_StringField.
  super_FieldBase.m_tag = local_188.m_tag;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_BaseSocketConnection).acceptorSessionID.m_senderCompID.super_StringField.
              super_FieldBase.m_string);
  (this->super_BaseSocketConnection).acceptorSessionID.m_senderCompID.super_StringField.
  super_FieldBase.m_metrics = local_188.m_metrics;
  (this->super_BaseSocketConnection).acceptorSessionID.m_senderCompID.super_StringField.
  super_FieldBase.m_data._M_string_length = 0;
  *(this->super_BaseSocketConnection).acceptorSessionID.m_senderCompID.super_StringField.
   super_FieldBase.m_data._M_dataplus._M_p = '\0';
  (this->super_BaseSocketConnection).acceptorSessionID.m_targetCompID.super_StringField.
  super_FieldBase.m_tag = local_130.m_tag;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_BaseSocketConnection).acceptorSessionID.m_targetCompID.super_StringField.
              super_FieldBase.m_string);
  (this->super_BaseSocketConnection).acceptorSessionID.m_targetCompID.super_StringField.
  super_FieldBase.m_metrics = local_130.m_metrics;
  (this->super_BaseSocketConnection).acceptorSessionID.m_targetCompID.super_StringField.
  super_FieldBase.m_data._M_string_length = 0;
  *(this->super_BaseSocketConnection).acceptorSessionID.m_targetCompID.super_StringField.
   super_FieldBase.m_data._M_dataplus._M_p = '\0';
  std::__cxx11::string::operator=
            ((string *)&(this->super_BaseSocketConnection).acceptorSessionID.m_sessionQualifier,
             (string *)&local_d8);
  (this->super_BaseSocketConnection).acceptorSessionID.m_isFIXT = local_b8;
  std::__cxx11::string::operator=
            ((string *)&(this->super_BaseSocketConnection).acceptorSessionID.m_frozenString,
             (string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase(&local_130);
  FIX::FieldBase::~FieldBase(&local_188);
  FIX::FieldBase::~FieldBase((FieldBase *)local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  FIX::FieldBase::~FieldBase(&local_88);
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  FIX::FieldBase::~FieldBase(&local_2d8);
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&stack0xfffffffffffffca8);
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT44(uStack_1f4,local_1f8) + 1);
  }
  uVar21 = 0x4946;
  uVar22 = 'X';
  uVar24 = '4';
  uVar26 = '2';
  uVar27 = '\0';
  _Var15._M_p = (pointer)&stack0xfffffffffffffcb8;
  FIX::TestSettings::pathForSpec((string *)local_1e0,(string *)&stack0xfffffffffffffca8);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            ((DataDictionaryProvider *)this,&local_2f0->m_beginString,(string *)local_1e0);
  if (local_1e0 != (undefined1  [8])pp_Var4) {
    operator_delete((void *)local_1e0,
                    CONCAT17(local_1d0[0]._M_local_buf[7],
                             CONCAT16(local_1d0[0]._M_local_buf[6],
                                      CONCAT15(local_1d0[0]._M_local_buf[5],
                                               CONCAT14(local_1d0[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1d0[0]._M_allocated_capacity)))) + 1);
  }
  if ((string *)_Var15._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var15._M_p,
                    CONCAT17(uVar25,CONCAT16(uVar23,CONCAT15(uVar27,CONCAT14(uVar26,CONCAT13(uVar24,
                                                  CONCAT12(uVar22,uVar21)))))) + 1);
  }
  uVar21 = 0x4946;
  uVar22 = 'X';
  uVar24 = '4';
  uVar26 = '2';
  uVar27 = '\0';
  _Var15._M_p = (pointer)&stack0xfffffffffffffcb8;
  FIX::TestSettings::pathForSpec((string *)local_1e0,(string *)&stack0xfffffffffffffca8);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (local_270,&local_2e0->m_beginString,(string *)local_1e0);
  if (local_1e0 != (undefined1  [8])pp_Var4) {
    operator_delete((void *)local_1e0,
                    CONCAT17(local_1d0[0]._M_local_buf[7],
                             CONCAT16(local_1d0[0]._M_local_buf[6],
                                      CONCAT15(local_1d0[0]._M_local_buf[5],
                                               CONCAT14(local_1d0[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1d0[0]._M_allocated_capacity)))) + 1);
  }
  if ((string *)_Var15._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var15._M_p,
                    CONCAT17(uVar25,CONCAT16(uVar23,CONCAT15(uVar27,CONCAT14(uVar26,CONCAT13(uVar24,
                                                  CONCAT12(uVar22,uVar21)))))) + 1);
  }
  this_02 = (TimeRange *)operator_new(0x40);
  FIX::DateTime::nowUtc();
  local_2d8._8_8_ = local_2d8._8_8_ & 0xffffffff00000000;
  local_2d8.m_string._M_dataplus._M_p = (pointer)0x0;
  local_2d8._vptr_FieldBase = (_func_int **)&PTR__DateTime_00326648;
  FIX::DateTime::nowUtc();
  FIX::TimeRange::TimeRange
            (this_02,(UtcTimeOnly *)&stack0xfffffffffffffca8,(UtcTimeOnly *)&local_2d8,0,0x1f);
  pTVar5 = (local_278->_M_t).
           super___uniq_ptr_impl<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>._M_t.
           super__Tuple_impl<0UL,_FIX::TimeRange_*,_std::default_delete<FIX::TimeRange>_>.
           super__Head_base<0UL,_FIX::TimeRange_*,_false>._M_head_impl;
  (local_278->_M_t).super___uniq_ptr_impl<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>._M_t
  .super__Tuple_impl<0UL,_FIX::TimeRange_*,_std::default_delete<FIX::TimeRange>_>.
  super__Head_base<0UL,_FIX::TimeRange_*,_false>._M_head_impl = this_02;
  if (pTVar5 != (TimeRange *)0x0) {
    operator_delete(pTVar5,0x40);
  }
  local_1d0[0]._M_allocated_capacity._0_4_ = 0x6e6e6f43;
  local_1d0[0]._M_local_buf[4] = 'e';
  local_1d0[0]._M_local_buf[5] = 'c';
  local_1d0[0]._M_local_buf[6] = 't';
  local_1d0[0]._M_local_buf[7] = 'i';
  local_1d0[0]._M_local_buf[8] = 'o';
  local_1d0[0]._M_local_buf[9] = 'n';
  local_1d0[0]._M_local_buf[10] = 'T';
  local_1d0[0]._11_2_ = 0x7079;
  local_1d0[0]._M_local_buf[0xd] = 'e';
  local_1d8 = (undefined1  [8])0xe;
  local_1d0[0]._M_local_buf[0xe] = '\0';
  uVar21 = 0x6e69;
  uVar23 = 'i';
  uVar25 = 't';
  uVar22 = 'i';
  uVar24 = 'a';
  uVar26 = 't';
  uVar27 = 'o';
  in_stack_fffffffffffffcc1 = in_stack_fffffffffffffcc1 & 0xffffff00;
  _Var15._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_1e0 = (undefined1  [8])pp_Var4;
  FIX::Dictionary::setString(local_300,(string *)local_1e0);
  if ((string *)_Var15._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var15._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  if (local_1e0 != (undefined1  [8])pp_Var4) {
    operator_delete((void *)local_1e0,
                    CONCAT17(local_1d0[0]._M_local_buf[7],
                             CONCAT16(local_1d0[0]._M_local_buf[6],
                                      CONCAT15(local_1d0[0]._M_local_buf[5],
                                               CONCAT14(local_1d0[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1d0[0]._M_allocated_capacity)))) + 1);
  }
  local_1d0[0]._M_allocated_capacity._0_4_ = 0x656c6946;
  local_1d0[0]._M_local_buf[4] = 'S';
  local_1d0[0]._M_local_buf[5] = 't';
  local_1d0[0]._M_local_buf[6] = 'o';
  local_1d0[0]._M_local_buf[7] = 'r';
  local_1d0[0]._M_local_buf[8] = 'e';
  local_1d0[0]._M_local_buf[9] = 'P';
  local_1d0[0]._M_local_buf[10] = 'a';
  local_1d0[0]._11_2_ = 0x6874;
  local_1d8 = (undefined1  [8])0xd;
  local_1d0[0]._M_local_buf[0xd] = '\0';
  uVar21 = 0x7473;
  uVar23 = 'o';
  uVar25 = 'r';
  uVar22 = 'e';
  uVar24 = '\0';
  _Var15._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_1e0 = (undefined1  [8])pp_Var4;
  FIX::Dictionary::setString(local_300,(string *)local_1e0);
  if ((string *)_Var15._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var15._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  if (local_1e0 != (undefined1  [8])pp_Var4) {
    operator_delete((void *)local_1e0,
                    CONCAT17(local_1d0[0]._M_local_buf[7],
                             CONCAT16(local_1d0[0]._M_local_buf[6],
                                      CONCAT15(local_1d0[0]._M_local_buf[5],
                                               CONCAT14(local_1d0[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1d0[0]._M_allocated_capacity)))) + 1);
  }
  _Var16._M_p = (pointer)0x11;
  local_1e0 = (undefined1  [8])pp_Var4;
  local_1e0 = (undefined1  [8])
              std::__cxx11::string::_M_create((ulong *)local_1e0,(ulong)&stack0xfffffffffffffca8);
  local_1d0[0]._M_allocated_capacity._0_4_ = SUB84(_Var16._M_p,0);
  local_1d0[0]._M_local_buf[4] = (undefined1)((ulong)_Var16._M_p >> 0x20);
  local_1d0[0]._M_local_buf[5] = (undefined1)((ulong)_Var16._M_p >> 0x28);
  local_1d0[0]._M_local_buf[6] = (undefined1)((ulong)_Var16._M_p >> 0x30);
  local_1d0[0]._M_local_buf[7] = (undefined1)((ulong)_Var16._M_p >> 0x38);
  *(undefined8 *)local_1e0 = 0x4461746144657355;
  *(undefined8 *)((long)local_1e0 + 8) = 0x72616e6f69746369;
  *(char *)((long)local_1e0 + 0x10) = 'y';
  *(char *)((long)local_1e0 + (long)_Var16._M_p) = '\0';
  uVar21 = 0x4e;
  _Var15._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_1d8 = (undefined1  [8])_Var16._M_p;
  FIX::Dictionary::setString(local_300,(string *)local_1e0);
  if ((string *)_Var15._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var15._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  if (local_1e0 != (undefined1  [8])pp_Var4) {
    operator_delete((void *)local_1e0,
                    CONCAT17(local_1d0[0]._M_local_buf[7],
                             CONCAT16(local_1d0[0]._M_local_buf[6],
                                      CONCAT15(local_1d0[0]._M_local_buf[5],
                                               CONCAT14(local_1d0[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1d0[0]._M_allocated_capacity)))) + 1);
  }
  local_1d0[0]._M_allocated_capacity._0_4_ = 0x72617453;
  local_1d0[0]._M_local_buf[4] = 't';
  local_1d0[0]._M_local_buf[5] = 'T';
  local_1d0[0]._M_local_buf[6] = 'i';
  local_1d0[0]._M_local_buf[7] = 'm';
  local_1d0[0]._M_local_buf[8] = 'e';
  local_1d0[0]._M_local_buf[9] = '\0';
  local_1d8 = (undefined1  [8])0x9;
  uVar21 = 0x3231;
  uVar23 = ':';
  uVar25 = '0';
  uVar22 = '0';
  uVar24 = ':';
  uVar26 = '0';
  uVar27 = '0';
  _Var15._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_1e0 = (undefined1  [8])pp_Var4;
  FIX::Dictionary::setString(local_300,(string *)local_1e0);
  if ((string *)_Var15._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var15._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  if (local_1e0 != (undefined1  [8])pp_Var4) {
    operator_delete((void *)local_1e0,
                    CONCAT17(local_1d0[0]._M_local_buf[7],
                             CONCAT16(local_1d0[0]._M_local_buf[6],
                                      CONCAT15(local_1d0[0]._M_local_buf[5],
                                               CONCAT14(local_1d0[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1d0[0]._M_allocated_capacity)))) + 1);
  }
  local_1d0[0]._M_allocated_capacity._0_4_ = 0x54646e45;
  local_1d0[0]._M_local_buf[4] = 'i';
  local_1d0[0]._M_local_buf[5] = 'm';
  local_1d0[0]._M_local_buf[6] = 'e';
  local_1d8 = (undefined1  [8])0x7;
  local_1d0[0]._M_local_buf[7] = '\0';
  uVar21 = 0x3231;
  uVar23 = ':';
  uVar25 = '0';
  uVar22 = '0';
  uVar24 = ':';
  uVar26 = '0';
  uVar27 = '0';
  uVar28 = '\0';
  _Var15._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_1e0 = (undefined1  [8])pp_Var4;
  FIX::Dictionary::setString(local_300,(string *)local_1e0);
  if ((string *)_Var15._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var15._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  if (local_1e0 != (undefined1  [8])pp_Var4) {
    operator_delete((void *)local_1e0,
                    CONCAT17(local_1d0[0]._M_local_buf[7],
                             CONCAT16(local_1d0[0]._M_local_buf[6],
                                      CONCAT15(local_1d0[0]._M_local_buf[5],
                                               CONCAT14(local_1d0[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1d0[0]._M_allocated_capacity)))) + 1);
  }
  local_1d0[0]._M_allocated_capacity._0_4_ = 0x72617453;
  local_1d0[0]._M_local_buf[4] = 't';
  local_1d0[0]._M_local_buf[5] = 'D';
  local_1d0[0]._M_local_buf[6] = 'a';
  local_1d0[0]._M_local_buf[7] = 'y';
  local_1d8 = (undefined1  [8])0x8;
  local_1d0[0]._M_local_buf[8] = '\0';
  uVar21 = 0x7553;
  uVar23 = 'n';
  uVar25 = '\0';
  _Var15._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_1e0 = (undefined1  [8])pp_Var4;
  FIX::Dictionary::setString(local_300,(string *)local_1e0);
  if ((string *)_Var15._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var15._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  if (local_1e0 != (undefined1  [8])pp_Var4) {
    operator_delete((void *)local_1e0,
                    CONCAT17(local_1d0[0]._M_local_buf[7],
                             CONCAT16(local_1d0[0]._M_local_buf[6],
                                      CONCAT15(local_1d0[0]._M_local_buf[5],
                                               CONCAT14(local_1d0[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1d0[0]._M_allocated_capacity)))) + 1);
  }
  local_1d0[0]._M_allocated_capacity._0_4_ = 0x44646e45;
  local_1d0[0]._M_local_buf[4] = 'a';
  local_1d0[0]._M_local_buf[5] = 'y';
  local_1d8 = (undefined1  [8])0x6;
  local_1d0[0]._M_local_buf[6] = '\0';
  uVar21 = 0x6f4d;
  uVar23 = 'n';
  uVar25 = '\0';
  _Var15._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_1e0 = (undefined1  [8])pp_Var4;
  FIX::Dictionary::setString(local_300,(string *)local_1e0);
  if ((string *)_Var15._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var15._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  if (local_1e0 != (undefined1  [8])pp_Var4) {
    operator_delete((void *)local_1e0,
                    CONCAT17(local_1d0[0]._M_local_buf[7],
                             CONCAT16(local_1d0[0]._M_local_buf[6],
                                      CONCAT15(local_1d0[0]._M_local_buf[5],
                                               CONCAT14(local_1d0[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1d0[0]._M_allocated_capacity)))) + 1);
  }
  local_1d0[0]._M_allocated_capacity._0_4_ = 0x72616548;
  local_1d0[0]._M_local_buf[4] = 't';
  local_1d0[0]._M_local_buf[5] = 'B';
  local_1d0[0]._M_local_buf[6] = 't';
  local_1d0[0]._M_local_buf[7] = 'I';
  local_1d0[0]._M_local_buf[8] = 'n';
  local_1d0[0]._M_local_buf[9] = 't';
  local_1d8 = (undefined1  [8])0xa;
  local_1d0[0]._M_local_buf[10] = '\0';
  uVar21 = 0x3033;
  iVar18 = 2;
  uVar19 = 0;
  uVar23 = '\0';
  _Var15._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_1e0 = (undefined1  [8])pp_Var4;
  FIX::Dictionary::setString(local_300,(string *)local_1e0);
  if ((string *)_Var15._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var15._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  if (local_1e0 != (undefined1  [8])pp_Var4) {
    operator_delete((void *)local_1e0,
                    CONCAT17(local_1d0[0]._M_local_buf[7],
                             CONCAT16(local_1d0[0]._M_local_buf[6],
                                      CONCAT15(local_1d0[0]._M_local_buf[5],
                                               CONCAT14(local_1d0[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1d0[0]._M_allocated_capacity)))) + 1);
  }
  local_1e0 = (undefined1  [8])&PTR__Dictionary_00320f50;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1d8,&(this->super_BaseSocketConnection).dictionaryInitiator.m_data._M_t);
  local_1a8._M_p = local_198;
  pcVar6 = (this->super_BaseSocketConnection).dictionaryInitiator.m_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar6,
             pcVar6 + (this->super_BaseSocketConnection).dictionaryInitiator.m_name._M_string_length
            );
  DVar12._4_12_ = in_stack_fffffffffffffc9c;
  DVar12._vptr_Dictionary._0_4_ = in_stack_fffffffffffffc98;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = _Var15._M_p;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = iVar18;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = uVar19;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_2_ = uVar21;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._2_1_ = uVar23;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._3_1_ = uVar25;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_1_ = uVar22;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._5_1_ = uVar24;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._6_1_ = uVar26;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._7_1_ = uVar27;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = uVar28;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right._1_4_ =
       in_stack_fffffffffffffcc1;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right._5_1_ =
       in_stack_fffffffffffffcc5;
  DVar12.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right._6_1_ =
       in_stack_fffffffffffffcc6;
  DVar12._47_17_ = in_stack_fffffffffffffcc7;
  DVar12.m_name._M_string_length = (size_type)_Var31._M_p;
  DVar12.m_name.field_2._M_allocated_capacity = (size_type)_Var32._M_p;
  DVar12.m_name.field_2._M_local_buf[8] = uVar33;
  DVar12.m_name.field_2._9_7_ = in_stack_fffffffffffffce9;
  FIX::SessionSettings::set(local_2e8,DVar12);
  FIX::Dictionary::~Dictionary((Dictionary *)local_1e0);
  uVar21 = 0x6f43;
  uVar23 = 'n';
  uVar25 = 'n';
  uVar22 = 'e';
  uVar24 = 'c';
  uVar26 = 't';
  uVar27 = 'i';
  uVar28 = '\0';
  local_2d8.m_string._M_dataplus._M_p = (pointer)0x726f747065636361;
  local_2d8.m_tag = 8;
  local_2d8._12_4_ = 0;
  local_2d8.m_string._M_string_length._0_1_ = 0;
  _Var32._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_2d8._vptr_FieldBase = (_func_int **)senderCompID;
  FIX::Dictionary::setString(local_2f8,(string *)&stack0xfffffffffffffca8);
  if ((string *)local_2d8._vptr_FieldBase != senderCompID) {
    operator_delete(local_2d8._vptr_FieldBase,(ulong)(local_2d8.m_string._M_dataplus._M_p + 1));
  }
  if ((string *)_Var32._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var32._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  uVar21 = 0x6946;
  uVar23 = 'l';
  uVar25 = 'e';
  uVar22 = 'S';
  uVar24 = 't';
  uVar26 = 'o';
  uVar27 = 'r';
  uVar19 = 0x68746150;
  uVar30 = '\0';
  local_2d8.m_string._M_dataplus._M_p._0_6_ = 0x65726f7473;
  local_2d8.m_tag = 5;
  local_2d8._12_4_ = 0;
  _Var32._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_2d8._vptr_FieldBase = (_func_int **)senderCompID;
  FIX::Dictionary::setString(local_2f8,(string *)&stack0xfffffffffffffca8);
  if ((string *)local_2d8._vptr_FieldBase != senderCompID) {
    operator_delete(local_2d8._vptr_FieldBase,(ulong)(local_2d8.m_string._M_dataplus._M_p + 1));
  }
  if ((string *)_Var32._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var32._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  local_2d8._vptr_FieldBase = (_func_int **)0x11;
  _Var32._M_p = (pointer)std::__cxx11::string::_M_create
                                   ((ulong *)&stack0xfffffffffffffca8,(ulong)&local_2d8);
  uVar21 = SUB82(local_2d8._vptr_FieldBase,0);
  uVar23 = (undefined1)((ulong)local_2d8._vptr_FieldBase >> 0x10);
  uVar25 = (undefined1)((ulong)local_2d8._vptr_FieldBase >> 0x18);
  uVar22 = (undefined1)((ulong)local_2d8._vptr_FieldBase >> 0x20);
  uVar24 = (undefined1)((ulong)local_2d8._vptr_FieldBase >> 0x28);
  uVar26 = (undefined1)((ulong)local_2d8._vptr_FieldBase >> 0x30);
  uVar27 = (undefined1)((ulong)local_2d8._vptr_FieldBase >> 0x38);
  (((string *)_Var32._M_p)->_M_dataplus)._M_p = (pointer)0x4461746144657355;
  ((string *)_Var32._M_p)->_M_string_length = 0x72616e6f69746369;
  (((string *)_Var32._M_p)->field_2)._M_local_buf[0] = 'y';
  *(undefined1 *)
   ((long)&(((string *)_Var32._M_p)->_M_dataplus)._M_p + (long)local_2d8._vptr_FieldBase) = 0;
  local_2d8.m_string._M_dataplus._M_p._0_2_ = 0x4e;
  local_2d8.m_tag = 1;
  local_2d8._12_4_ = 0;
  local_2d8._vptr_FieldBase = (_func_int **)senderCompID;
  FIX::Dictionary::setString(local_2f8,(string *)&stack0xfffffffffffffca8);
  if ((string *)local_2d8._vptr_FieldBase != senderCompID) {
    operator_delete(local_2d8._vptr_FieldBase,(ulong)(local_2d8.m_string._M_dataplus._M_p + 1));
  }
  if ((string *)_Var32._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var32._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  uVar21 = 0x7453;
  uVar23 = 'a';
  uVar25 = 'r';
  uVar22 = 't';
  uVar24 = 'T';
  uVar26 = 'i';
  uVar27 = 'm';
  uVar19 = uVar19 & 0xffffff00;
  local_2d8.m_string._M_dataplus._M_p = (pointer)0x30303a30303a3231;
  local_2d8.m_tag = 8;
  local_2d8._12_4_ = 0;
  local_2d8.m_string._M_string_length._0_1_ = 0;
  _Var32._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_2d8._vptr_FieldBase = (_func_int **)senderCompID;
  FIX::Dictionary::setString(local_2f8,(string *)&stack0xfffffffffffffca8);
  if ((string *)local_2d8._vptr_FieldBase != senderCompID) {
    operator_delete(local_2d8._vptr_FieldBase,(ulong)(local_2d8.m_string._M_dataplus._M_p + 1));
  }
  if ((string *)_Var32._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var32._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  uVar21 = 0x6e45;
  uVar23 = 'd';
  uVar25 = 'T';
  uVar22 = 'i';
  uVar24 = 'm';
  uVar26 = 'e';
  uVar27 = '\0';
  local_2d8.m_string._M_dataplus._M_p = (pointer)0x30303a30303a3231;
  local_2d8.m_tag = 8;
  local_2d8._12_4_ = 0;
  local_2d8.m_string._M_string_length._0_1_ = 0;
  _Var32._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_2d8._vptr_FieldBase = (_func_int **)senderCompID;
  FIX::Dictionary::setString(local_2f8,(string *)&stack0xfffffffffffffca8);
  if ((string *)local_2d8._vptr_FieldBase != senderCompID) {
    operator_delete(local_2d8._vptr_FieldBase,(ulong)(local_2d8.m_string._M_dataplus._M_p + 1));
  }
  if ((string *)_Var32._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var32._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  uVar21 = 0x7453;
  uVar23 = 'a';
  uVar25 = 'r';
  uVar22 = 't';
  uVar24 = 'D';
  uVar26 = 'a';
  uVar27 = 'y';
  uVar29 = '\0';
  local_2d8.m_string._M_dataplus._M_p._0_4_ = 0x6e7553;
  local_2d8.m_tag = 3;
  local_2d8._12_4_ = 0;
  _Var32._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_2d8._vptr_FieldBase = (_func_int **)senderCompID;
  FIX::Dictionary::setString(local_2f8,(string *)&stack0xfffffffffffffca8);
  if ((string *)local_2d8._vptr_FieldBase != senderCompID) {
    operator_delete(local_2d8._vptr_FieldBase,(ulong)(local_2d8.m_string._M_dataplus._M_p + 1));
  }
  if ((string *)_Var32._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var32._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  uVar21 = 0x6e45;
  uVar23 = 'd';
  uVar25 = 'D';
  uVar22 = 'a';
  uVar24 = 'y';
  iVar18 = 6;
  uVar20 = 0;
  uVar26 = '\0';
  local_2d8.m_string._M_dataplus._M_p._0_4_ = 0x6e6f4d;
  local_2d8.m_tag = 3;
  local_2d8._12_4_ = 0;
  _Var32._M_p = (pointer)&stack0xfffffffffffffcb8;
  local_2d8._vptr_FieldBase = (_func_int **)senderCompID;
  FIX::Dictionary::setString(local_2f8,(string *)&stack0xfffffffffffffca8);
  if ((string *)local_2d8._vptr_FieldBase != senderCompID) {
    operator_delete(local_2d8._vptr_FieldBase,(ulong)(local_2d8.m_string._M_dataplus._M_p + 1));
  }
  if ((string *)_Var32._M_p != (string *)&stack0xfffffffffffffcb8) {
    operator_delete(_Var32._M_p,
                    CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar24,CONCAT14(uVar22,CONCAT13(uVar25,
                                                  CONCAT12(uVar23,uVar21)))))) + 1);
  }
  ppuVar17 = &PTR__Dictionary_00320f50;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&stack0xfffffffffffffcb0,
             &(this->super_BaseSocketConnection).dictionaryAcceptor.m_data._M_t);
  _Var32._M_p = local_310;
  pcVar6 = (this->super_BaseSocketConnection).dictionaryAcceptor.m_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffce0,pcVar6,
             pcVar6 + (this->super_BaseSocketConnection).dictionaryAcceptor.m_name._M_string_length)
  ;
  DVar13._4_12_ = in_stack_fffffffffffffc9c;
  DVar13._vptr_Dictionary._0_4_ = in_stack_fffffffffffffc98;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = ppuVar17;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = iVar18;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = uVar20;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_2_ = uVar21;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._2_1_ = uVar23;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._3_1_ = uVar25;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_1_ = uVar22;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._5_1_ = uVar24;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._6_1_ = uVar26;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left._7_1_ = uVar27;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = uVar29;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right._1_4_ = uVar19;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right._5_1_ = uVar30;
  DVar13.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right._6_1_ = uVar28;
  DVar13._47_17_ = in_stack_fffffffffffffcc7;
  DVar13.m_name._M_string_length = (size_type)_Var31._M_p;
  DVar13.m_name.field_2._M_allocated_capacity = (size_type)_Var32._M_p;
  DVar13.m_name.field_2._M_local_buf[8] = uVar33;
  DVar13.m_name.field_2._9_7_ = in_stack_fffffffffffffce9;
  FIX::SessionSettings::set(local_280,DVar13);
  FIX::Dictionary::~Dictionary((Dictionary *)&stack0xfffffffffffffca8);
  pTVar14 = (TestSession *)operator_new(0x888);
  app = &(this->super_BaseSocketConnection).application;
  factory = &(this->super_BaseSocketConnection).factory;
  CATCH2_INTERNAL_TEST_0()::TestSession::TestSession(FIX::Application&,FIX::MessageStoreFactory&,FIX
  ::SessionID_const&,FIX::DataDictionaryProvider&,FIX::TimeRange_const__int_
            (pTVar14,(Application *)app,(MessageStoreFactory *)factory,local_2e0,local_270,
             (local_278->_M_t).
             super___uniq_ptr_impl<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>._M_t.
             super__Tuple_impl<0UL,_FIX::TimeRange_*,_std::default_delete<FIX::TimeRange>_>.
             super__Head_base<0UL,_FIX::TimeRange_*,_false>._M_head_impl,in_stack_fffffffffffffc98);
  pTVar7 = (this->super_BaseSocketConnection).acceptorSession._M_t.
           super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
           super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
           super__Head_base<0UL,_TestSession_*,_false>._M_head_impl;
  (this->super_BaseSocketConnection).acceptorSession._M_t.
  super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
  super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
  super__Head_base<0UL,_TestSession_*,_false>._M_head_impl = pTVar14;
  if (pTVar7 != (TestSession *)0x0) {
    (**(code **)(*(long *)pTVar7 + 8))();
  }
  this_03 = (SocketAcceptor *)operator_new(0x1d8);
  pTVar7 = (this->super_BaseSocketConnection).acceptorSession._M_t.
           super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
           super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
           super__Head_base<0UL,_TestSession_*,_false>._M_head_impl;
  FIX::SocketAcceptor::SocketAcceptor
            (this_03,(Application *)app,(MessageStoreFactory *)factory,(SessionSettings *)local_280,
             &(this->super_BaseSocketConnection).logFactory.super_LogFactory);
  *(undefined ***)this_03 = &PTR__SocketAcceptor_0032b6e8;
  *(undefined ***)(this_03 + 0x130) = &PTR__TestSocketAcceptor_0032b768;
  *(TestSession **)(this_03 + 0x1d0) = pTVar7;
  pSVar8 = (this->super_BaseSocketConnection).acceptor._M_t.
           super___uniq_ptr_impl<FIX::SocketAcceptor,_std::default_delete<FIX::SocketAcceptor>_>.
           _M_t.
           super__Tuple_impl<0UL,_FIX::SocketAcceptor_*,_std::default_delete<FIX::SocketAcceptor>_>.
           super__Head_base<0UL,_FIX::SocketAcceptor_*,_false>._M_head_impl;
  (this->super_BaseSocketConnection).acceptor._M_t.
  super___uniq_ptr_impl<FIX::SocketAcceptor,_std::default_delete<FIX::SocketAcceptor>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketAcceptor_*,_std::default_delete<FIX::SocketAcceptor>_>.
  super__Head_base<0UL,_FIX::SocketAcceptor_*,_false>._M_head_impl = this_03;
  if (pSVar8 != (SocketAcceptor *)0x0) {
    (**(code **)(*(long *)pSVar8 + 8))();
  }
  this_04 = (SocketInitiator *)operator_new(0x488);
  FIX::SocketInitiator::SocketInitiator
            (this_04,(Application *)app,(MessageStoreFactory *)factory,(SessionSettings *)local_2e8)
  ;
  pSVar9 = (this->super_BaseSocketConnection).initiator._M_t.
           super___uniq_ptr_impl<FIX::SocketInitiator,_std::default_delete<FIX::SocketInitiator>_>.
           _M_t.
           super__Tuple_impl<0UL,_FIX::SocketInitiator_*,_std::default_delete<FIX::SocketInitiator>_>
           .super__Head_base<0UL,_FIX::SocketInitiator_*,_false>._M_head_impl;
  (this->super_BaseSocketConnection).initiator._M_t.
  super___uniq_ptr_impl<FIX::SocketInitiator,_std::default_delete<FIX::SocketInitiator>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketInitiator_*,_std::default_delete<FIX::SocketInitiator>_>.
  super__Head_base<0UL,_FIX::SocketInitiator_*,_false>._M_head_impl = this_04;
  if (pSVar9 != (SocketInitiator *)0x0) {
    (**(code **)(*(long *)pSVar9 + 8))();
  }
  pTVar14 = (TestSession *)operator_new(0x888);
  CATCH2_INTERNAL_TEST_0()::TestSession::TestSession(FIX::Application&,FIX::MessageStoreFactory&,FIX
  ::SessionID_const&,FIX::DataDictionaryProvider&,FIX::TimeRange_const__int_
            (pTVar14,(Application *)app,(MessageStoreFactory *)factory,local_2f0,
             (DataDictionaryProvider *)this,
             (this->super_BaseSocketConnection).sessionTime._M_t.
             super___uniq_ptr_impl<FIX::TimeRange,_std::default_delete<FIX::TimeRange>_>._M_t.
             super__Tuple_impl<0UL,_FIX::TimeRange_*,_std::default_delete<FIX::TimeRange>_>.
             super__Head_base<0UL,_FIX::TimeRange_*,_false>._M_head_impl,in_stack_fffffffffffffc98);
  pTVar7 = (this->super_BaseSocketConnection).initiatorSession._M_t.
           super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
           super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
           super__Head_base<0UL,_TestSession_*,_false>._M_head_impl;
  (this->super_BaseSocketConnection).initiatorSession._M_t.
  super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
  super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
  super__Head_base<0UL,_TestSession_*,_false>._M_head_impl = pTVar14;
  if (pTVar7 != (TestSession *)0x0) {
    (**(code **)(*(long *)pTVar7 + 8))();
  }
  this_05 = (TestSocketInitiator *)operator_new(0x490);
  pTVar7 = (this->super_BaseSocketConnection).initiatorSession._M_t.
           super___uniq_ptr_impl<TestSession,_std::default_delete<TestSession>_>._M_t.
           super__Tuple_impl<0UL,_TestSession_*,_std::default_delete<TestSession>_>.
           super__Head_base<0UL,_TestSession_*,_false>._M_head_impl;
  FIX::SocketInitiator::SocketInitiator
            ((SocketInitiator *)this_05,(Application *)app,(MessageStoreFactory *)factory,
             (SessionSettings *)local_2e8);
  *(undefined ***)this_05 = &PTR__SocketInitiator_0032b7d0;
  *(undefined ***)&this_05->field_0x228 = &PTR__TestSocketInitiator_0032b858;
  this_05->pSession = &pTVar7->super_Session;
  pTVar10 = (this->super_BaseSocketConnection).testInitiator._M_t.
            super___uniq_ptr_impl<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_>.
            _M_t.
            super__Tuple_impl<0UL,_TestSocketInitiator_*,_std::default_delete<TestSocketInitiator>_>
            .super__Head_base<0UL,_TestSocketInitiator_*,_false>._M_head_impl;
  (this->super_BaseSocketConnection).testInitiator._M_t.
  super___uniq_ptr_impl<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_>._M_t.
  super__Tuple_impl<0UL,_TestSocketInitiator_*,_std::default_delete<TestSocketInitiator>_>.
  super__Head_base<0UL,_TestSocketInitiator_*,_false>._M_head_impl = this_05;
  if (pTVar10 != (TestSocketInitiator *)0x0) {
    (**(code **)(*(long *)pTVar10 + 8))();
  }
  (this->pSocketConnection)._M_t.
  super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>.
  super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl = (SocketConnection *)0x0;
  this_06 = (SocketConnection *)operator_new(0x2100);
  FIX::SocketConnection::SocketConnection
            (this_06,&((this->super_BaseSocketConnection).testInitiator._M_t.
                       super___uniq_ptr_impl<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_TestSocketInitiator_*,_std::default_delete<TestSocketInitiator>_>
                       .super__Head_base<0UL,_TestSocketInitiator_*,_false>._M_head_impl)->
                      super_SocketInitiator,local_2f0,(this->super_BaseSocketConnection).socket,
             local_1e8);
  pSVar11 = (this->pSocketConnection)._M_t.
            super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>
            ._M_t.
            super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>
            .super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl;
  (this->pSocketConnection)._M_t.
  super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>.
  super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl = this_06;
  if (pSVar11 != (SocketConnection *)0x0) {
    (**(code **)(*(long *)pSVar11 + 8))();
  }
  return;
}

Assistant:

TestSessionConnection()
        : BaseSocketConnection() {
      pSocketConnection.reset(new SocketConnection(*testInitiator, initiatorSessionID, socket, &monitor));
    }